

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void * pythonInputOpenCallback(char *URI)

{
  PyObject *ret;
  char *URI_local;
  
  URI_local = (char *)_PyObject_CallFunction_SizeT(pythonInputOpenCallbackObject,"s",URI);
  if (URI_local == &_Py_NoneStruct) {
    _Py_DECREF((PyObject *)&_Py_NoneStruct);
    URI_local = (char *)0x0;
  }
  return URI_local;
}

Assistant:

static void *
pythonInputOpenCallback(const char *URI)
{
    PyObject *ret;

    ret = PyObject_CallFunction(pythonInputOpenCallbackObject,
	    (char *)"s", URI);
    if (ret == Py_None) {
	Py_DECREF(Py_None);
	return NULL;
    }
    return ret;
}